

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O3

int tc_uECC_valid_public_key(uint8_t *public_key,tc_uECC_Curve curve)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint local_68 [2];
  tc_uECC_word_t _public [16];
  
  cVar1 = curve->num_bytes;
  tc_uECC_vli_bytesToNative(local_68,public_key,(int)cVar1);
  tc_uECC_vli_bytesToNative(_public + (long)curve->num_words + -2,public_key + cVar1,(int)cVar1);
  uVar2 = 0xf;
  do {
    if ((char)uVar2 < '\0') {
      return -4;
    }
    uVar4 = (ulong)((uVar2 & 0x7f) << 2);
    uVar2 = uVar2 - 1;
  } while (*(int *)((long)local_68 + uVar4) == *(int *)((long)curve->G + uVar4));
  iVar3 = tc_uECC_valid_point(local_68,curve);
  return iVar3;
}

Assistant:

int tc_uECC_valid_public_key(const uint8_t *public_key, tc_uECC_Curve curve)
{

	tc_uECC_word_t _public[NUM_ECC_WORDS * 2];

	tc_uECC_vli_bytesToNative(_public, public_key, curve->num_bytes);
	tc_uECC_vli_bytesToNative(
	_public + curve->num_words,
	public_key + curve->num_bytes,
	curve->num_bytes);

	if (tc_uECC_vli_cmp_unsafe(_public, curve->G, NUM_ECC_WORDS * 2) == 0) {
		return -4;
	}

	return tc_uECC_valid_point(_public, curve);
}